

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

Matrix4x4 * CMU462::operator*(Matrix4x4 *__return_storage_ptr__,double c,Matrix4x4 *A)

{
  double dVar1;
  Matrix4x4 *cA;
  
  dVar1 = A->entries[0].y;
  __return_storage_ptr__->entries[0].x = A->entries[0].x * c;
  __return_storage_ptr__->entries[0].y = dVar1 * c;
  dVar1 = A->entries[0].w;
  __return_storage_ptr__->entries[0].z = A->entries[0].z * c;
  __return_storage_ptr__->entries[0].w = dVar1 * c;
  dVar1 = A->entries[1].y;
  __return_storage_ptr__->entries[1].x = A->entries[1].x * c;
  __return_storage_ptr__->entries[1].y = dVar1 * c;
  dVar1 = A->entries[1].w;
  __return_storage_ptr__->entries[1].z = A->entries[1].z * c;
  __return_storage_ptr__->entries[1].w = dVar1 * c;
  dVar1 = A->entries[2].y;
  __return_storage_ptr__->entries[2].x = A->entries[2].x * c;
  __return_storage_ptr__->entries[2].y = dVar1 * c;
  dVar1 = A->entries[2].w;
  __return_storage_ptr__->entries[2].z = A->entries[2].z * c;
  __return_storage_ptr__->entries[2].w = dVar1 * c;
  dVar1 = A->entries[3].y;
  __return_storage_ptr__->entries[3].x = A->entries[3].x * c;
  __return_storage_ptr__->entries[3].y = dVar1 * c;
  dVar1 = A->entries[3].w;
  __return_storage_ptr__->entries[3].z = A->entries[3].z * c;
  __return_storage_ptr__->entries[3].w = dVar1 * c;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 operator*( double c, const Matrix4x4& A ) {

    Matrix4x4 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);//0
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//4
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//8
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//12
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//15
	//16
    return cA;
  }